

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadAssetInfo(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  anon_enum_32 aVar4;
  char *__s1;
  undefined4 extraout_var;
  ai_real aVar5;
  ai_real extraout_XMM0_Da;
  allocator local_59;
  StringMetaData *local_58;
  string local_50;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar2 == '\0') {
    local_58 = &this->mAssetMetaData;
    do {
      while( true ) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar2 == '\0') {
          return;
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar2 != 1) break;
        bVar1 = IsElement(this,"unit");
        if (bVar1) {
          uVar3 = TestAttribute(this,"meter");
          aVar5 = 1.0;
          if (uVar3 != 0xffffffff) {
            (*this->mReader->_vptr_IIrrXMLReader[0xc])(this->mReader,(ulong)uVar3);
            aVar5 = extraout_XMM0_Da;
          }
          this->mUnitSize = aVar5;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((char)iVar2 == '\0') {
            SkipElement(this);
          }
        }
        else {
          bVar1 = IsElement(this,"up_axis");
          if (bVar1) {
            __s1 = GetTextContent(this);
            iVar2 = strncmp(__s1,"X_UP",4);
            if (iVar2 == 0) {
              aVar4 = UP_X;
            }
            else {
              iVar2 = strncmp(__s1,"Z_UP",4);
              aVar4 = (iVar2 == 0) + UP_Y;
            }
            this->mUpDirection = aVar4;
            TestClosing(this,"up_axis");
          }
          else {
            bVar1 = IsElement(this,"contributor");
            if (bVar1) {
              ReadContributorInfo(this);
            }
            else {
              ReadMetaDataItem(this,local_58);
            }
          }
        }
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar2 != 2);
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"asset");
    if (iVar2 != 0) {
      std::__cxx11::string::string((string *)&local_50,"Expected end of <asset> element.",&local_59)
      ;
      ThrowException(this,&local_50);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadAssetInfo()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("unit"))
            {
                // read unit data from the element's attributes
                const int attrIndex = TestAttribute("meter");
                if (attrIndex == -1) {
                    mUnitSize = 1.f;
                }
                else {
                    mUnitSize = mReader->getAttributeValueAsFloat(attrIndex);
                }

                // consume the trailing stuff
                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else if (IsElement("up_axis"))
            {
                // read content, strip whitespace, compare
                const char* content = GetTextContent();
                if (strncmp(content, "X_UP", 4) == 0)
                    mUpDirection = UP_X;
                else if (strncmp(content, "Z_UP", 4) == 0)
                    mUpDirection = UP_Z;
                else
                    mUpDirection = UP_Y;

                // check element end
                TestClosing("up_axis");
            }
            else if (IsElement("contributor"))
            {
                ReadContributorInfo();
            }
            else
            {
                ReadMetaDataItem(mAssetMetaData);
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "asset") != 0)
                ThrowException("Expected end of <asset> element.");

            break;
        }
    }
}